

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::BaseAtomTypesSectionParser::parseLine
          (BaseAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  int iVar2;
  AtomType *this_00;
  SimpleTypeData<double> *this_01;
  RealType m;
  allocator<char> local_d1;
  string baseAtomTypeName;
  shared_ptr<OpenMD::GenericData> local_b0;
  RealType nelectron;
  string local_98;
  StringTokenizer tokenizer;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&baseAtomTypeName," ;\t\n\r",(allocator<char> *)&local_98);
  StringTokenizer::StringTokenizer(&tokenizer,line,&baseAtomTypeName);
  std::__cxx11::string::~string((string *)&baseAtomTypeName);
  iVar2 = StringTokenizer::countTokens(&tokenizer);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,"BaseAtomTypesSectionParser Error: Not enough tokens at line %d\n"
             ,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&baseAtomTypeName,&tokenizer);
    this_00 = ForceField::getAtomType(ff,&baseAtomTypeName);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_00);
      AtomType::setIdent(this_00,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
      AtomType::setName(this_00,&baseAtomTypeName);
      ForceField::addAtomType(ff,&baseAtomTypeName,this_00);
    }
    m = StringTokenizer::nextTokenAsDouble(&tokenizer);
    AtomType::setMass(this_00,m);
    bVar1 = StringTokenizer::hasMoreTokens(&tokenizer);
    if (bVar1) {
      nelectron = StringTokenizer::nextTokenAsDouble(&tokenizer);
      this_01 = (SimpleTypeData<double> *)operator_new(0x30);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"nelectron",&local_d1);
      SimpleTypeData<double>::SimpleTypeData(this_01,&local_98,&nelectron);
      std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<OpenMD::SimpleTypeData<double>,void>
                ((__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> *)&local_b0,this_01);
      AtomType::addProperty(this_00,&local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b0.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)&baseAtomTypeName);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void BaseAtomTypesSectionParser::parseLine(ForceField& ff,
                                             const std::string& line,
                                             int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in BaseAtomTypeSection, a line at least contains 2 tokens
    // atomTypeName and mass
    if (nTokens < 2) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "BaseAtomTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string baseAtomTypeName = tokenizer.nextToken();
      AtomType* baseAtomType       = ff.getAtomType(baseAtomTypeName);

      if (baseAtomType == NULL) {
        baseAtomType = new AtomType();
        int ident    = ff.getNAtomType();
        baseAtomType->setIdent(ident);
        baseAtomType->setName(baseAtomTypeName);
        ff.addAtomType(baseAtomTypeName, baseAtomType);
      }

      //    else {
      //         snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //         "BaseAtomTypesSectionParser Error: Duplicate BaseAtomType at
      //         line %d\n",
      //                 lineNo);
      //         painCave.isFatal = 1;
      //         simError();
      //       }

      RealType mass = tokenizer.nextTokenAsDouble();
      baseAtomType->setMass(mass);
      if (tokenizer.hasMoreTokens()) {
        RealType nelectron = tokenizer.nextTokenAsDouble();
        baseAtomType->addProperty(std::shared_ptr<GenericData>(
            new DoubleGenericData("nelectron", nelectron)));
      }
    }
  }